

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.hpp
# Opt level: O3

double webfront::log::anon_unknown_3::log(double __x)

{
  pointer pfVar1;
  _Alloc_hider _Var2;
  uint uVar3;
  long lVar4;
  _List *p_Var5;
  long *in_RDX;
  function<void_(std::basic_string_view<char,_std::char_traits<char>_>)> *s_1;
  path *this;
  pointer pfVar6;
  double extraout_XMM0_Qa;
  string_view fmt;
  char local_f9;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_f8;
  string local_f0;
  uint local_cc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  path local_a8;
  string_view text_local;
  size_type local_70;
  pointer local_68;
  path local_60;
  char *local_38;
  
  local_f9 = 'D';
  local_f8.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  if ((undefined8 *)*in_RDX == (undefined8 *)0x0) {
    local_38 = "";
  }
  else {
    local_38 = *(char **)*in_RDX;
  }
  this = &local_a8;
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            (this,&local_38,auto_format);
  if (local_a8._M_pathname._M_string_length != 0) {
    uVar3 = local_a8._32_4_;
    if ((~local_a8._M_cmpts & 3) == 0) {
LAB_00135a4c:
      http::std::filesystem::__cxx11::path::path(&local_60,(path *)this);
      goto LAB_00135a6b;
    }
    if (((local_a8._32_8_ & 3) == 0) &&
       (local_a8._M_pathname._M_dataplus._M_p[local_a8._M_pathname._M_string_length - 1] != '/')) {
      if ((local_a8._32_8_ & 3) == 0) {
        lVar4 = std::filesystem::__cxx11::path::_List::end();
        this = (path *)(lVar4 + -0x30);
        p_Var5 = (_List *)(lVar4 + -0x10);
        if ((local_a8._32_8_ & 3) != 0) {
          p_Var5 = &local_a8._M_cmpts;
          this = &local_a8;
        }
        uVar3 = (uint)*(undefined8 *)p_Var5;
      }
      else {
        this = &local_a8;
      }
      if ((~uVar3 & 3) == 0) goto LAB_00135a4c;
    }
  }
  http::std::filesystem::__cxx11::path::path(&local_60);
LAB_00135a6b:
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c8,local_60._M_pathname._M_dataplus._M_p,
             local_60._M_pathname._M_dataplus._M_p + local_60._M_pathname._M_string_length);
  if (*in_RDX == 0) {
    local_cc = 0;
  }
  else {
    local_cc = *(uint *)(*in_RDX + 0x10);
  }
  fmt._M_str = "[{}] {:%T} | {:16}:{:4} | {}";
  fmt._M_len = 0x1c;
  std::
  format<char,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::__cxx11::string,unsigned_int,std::basic_string_view<char,std::char_traits<char>>&>
            (&local_f0,fmt,&local_f9,&local_f8,&local_c8,&local_cc,
             (basic_string_view<char,_std::char_traits<char>_> *)&text_local);
  _Var2._M_p = local_f0._M_dataplus._M_p;
  pfVar1 = Sinks::sinks.
           super__Vector_base<std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (Sinks::sinks.
      super__Vector_base<std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      Sinks::sinks.
      super__Vector_base<std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pfVar6 = Sinks::sinks.
             super__Vector_base<std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (*(long *)(pfVar6 + 0x10) != 0) {
        local_70 = local_f0._M_string_length;
        local_68 = _Var2._M_p;
        (**(code **)(pfVar6 + 0x18))(pfVar6,&local_70);
      }
      pfVar6 = pfVar6 + 0x20;
    } while (pfVar6 != pfVar1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  http::std::filesystem::__cxx11::path::~path(&local_60);
  http::std::filesystem::__cxx11::path::~path((path *)&local_a8);
  return extraout_XMM0_Qa;
}

Assistant:

inline static void log(LogType l, string_view text, const srcLoc& s) {
        out(format("[{}] {:%T} | {:16}:{:4} | {}", toChar(l), chrono::system_clock::now(), filesystem::path(s.file_name()).filename().string(), s.line(), text));
    }